

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ArenaStringPtr::ReleaseNonDefault
          (ArenaStringPtr *this,string *default_value,Arena *arena)

{
  bool bVar1;
  string *psVar2;
  LogMessage *pLVar3;
  string *this_00;
  string *released_1;
  LogMessage local_b8;
  string *local_80;
  string *released;
  byte local_61;
  LogMessage local_60;
  Arena *local_28;
  Arena *arena_local;
  string *default_value_local;
  ArenaStringPtr *this_local;
  
  local_28 = arena;
  arena_local = (Arena *)default_value;
  default_value_local = (string *)this;
  bVar1 = IsDefault(this,default_value);
  local_61 = 0;
  if (bVar1) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arenastring.cc"
               ,0xad);
    local_61 = 1;
    pLVar3 = LogMessage::operator<<(&local_60,"CHECK failed: !IsDefault(default_value): ");
    LogFinisher::operator=((LogFinisher *)((long)&released + 3),pLVar3);
  }
  if ((local_61 & 1) != 0) {
    LogMessage::~LogMessage(&local_60);
  }
  bVar1 = IsDonatedString(this);
  if (bVar1) {
    released_1._7_1_ = 0;
    if (local_28 == (Arena *)0x0) {
      LogMessage::LogMessage
                (&local_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arenastring.cc"
                 ,0xba);
      released_1._7_1_ = 1;
      pLVar3 = LogMessage::operator<<(&local_b8,"CHECK failed: arena != nullptr: ");
      LogFinisher::operator=((LogFinisher *)((long)&released_1 + 6),pLVar3);
    }
    if ((released_1._7_1_ & 1) != 0) {
      LogMessage::~LogMessage(&local_b8);
    }
    this_00 = (string *)operator_new(0x20);
    psVar2 = Get_abi_cxx11_(this);
    std::__cxx11::string::string(this_00,(string *)psVar2);
    TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
              (&this->tagged_ptr_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arena_local);
    this_local = (ArenaStringPtr *)this_00;
  }
  else {
    if (local_28 == (Arena *)0x0) {
      local_80 = UnsafeMutablePointer_abi_cxx11_(this);
    }
    else {
      psVar2 = (string *)operator_new(0x20);
      std::__cxx11::string::string((string *)psVar2);
      local_80 = psVar2;
      UnsafeMutablePointer_abi_cxx11_(this);
      std::__cxx11::string::swap((string *)psVar2);
    }
    TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
              (&this->tagged_ptr_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arena_local);
    this_local = (ArenaStringPtr *)local_80;
  }
  return (string *)this_local;
}

Assistant:

std::string* ArenaStringPtr::ReleaseNonDefault(const std::string* default_value,
                                               ::google::protobuf::Arena* arena) {
  GOOGLE_DCHECK(!IsDefault(default_value));

  if (!IsDonatedString()) {
    std::string* released;
    if (arena != nullptr) {
      released = new std::string;
      released->swap(*UnsafeMutablePointer());
    } else {
      released = UnsafeMutablePointer();
    }
    tagged_ptr_.Set(const_cast<std::string*>(default_value));
    return released;
  } else /* IsDonatedString() */ {
    GOOGLE_DCHECK(arena != nullptr);
    std::string* released = new std::string(Get());
    tagged_ptr_.Set(const_cast<std::string*>(default_value));
    return released;
  }
}